

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest::run_readwrite_instruction_with_pagecrossing
          (CpuAbsoluteIndexedTest *this,uint8_t instruction,IndexReg index_reg,
          uint8_t new_memory_content)

{
  uint16_t uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar5;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar6;
  MockSpec<void_(unsigned_short,_unsigned_char)> *pMVar7;
  char *message;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar;
  Matcher<unsigned_char> local_2c0;
  Matcher<unsigned_short> local_2a8;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_290;
  WithoutMatchers local_251;
  Matcher<unsigned_char> local_250;
  Matcher<unsigned_short> local_238;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_220;
  ReturnAction<unsigned_char> local_1e8;
  Action<unsigned_char_(unsigned_short)> local_1d8;
  WithoutMatchers local_1b1;
  Matcher<unsigned_short> local_1b0;
  MockSpec<unsigned_char_(unsigned_short)> local_198;
  ReturnAction<int> local_178;
  Action<unsigned_char_(unsigned_short)> local_168;
  WithoutMatchers local_141;
  Matcher<unsigned_short> local_140;
  MockSpec<unsigned_char_(unsigned_short)> local_128;
  ReturnAction<int> local_108;
  Action<unsigned_char_(unsigned_short)> local_f8;
  WithoutMatchers local_d1;
  Matcher<unsigned_short> local_d0;
  MockSpec<unsigned_char_(unsigned_short)> local_b8;
  ReturnAction<int> local_98;
  Action<unsigned_char_(unsigned_short)> local_88;
  WithoutMatchers local_65 [13];
  Matcher<unsigned_short> local_58;
  MockSpec<unsigned_char_(unsigned_short)> local_40;
  undefined2 local_1c;
  undefined1 local_1a;
  uint8_t local_19;
  IndexReg local_18;
  uint16_t effective_address;
  uint8_t index_reg_value;
  uint8_t new_memory_content_local;
  IndexReg index_reg_local;
  uint8_t instruction_local;
  CpuAbsoluteIndexedTest *this_local;
  
  uVar1 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar1;
  (this->super_CpuTest).registers.pc = uVar1;
  local_19 = new_memory_content;
  local_18 = index_reg;
  new_memory_content_local = instruction;
  _index_reg_local = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  uVar2 = (this->super_CpuTest).expected.pc;
  if (!SCARRY4((uint)uVar2,2)) {
    (this->super_CpuTest).expected.pc = uVar2 + 2;
    local_1a = 0x91;
    set_index_reg(this,local_18,0x91);
    local_1c = 0x5709;
    testing::Matcher<unsigned_short>::Matcher
              (&local_58,*(short *)&(this->super_CpuTest).field_0x112 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_40,&(this->super_CpuTest).mmu.super_MockMmu,&local_58);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_40,local_65,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                        ,0x89,"mmu","read_byte(start_pc + 1u)");
    testing::Return<int>((testing *)&local_98,0x78);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_88,(ReturnAction *)&local_98);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_88);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_88);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_98);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_40);
    testing::Matcher<unsigned_short>::~Matcher(&local_58);
    testing::Matcher<unsigned_short>::Matcher
              (&local_d0,*(short *)&(this->super_CpuTest).field_0x112 + 2);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_b8,&(this->super_CpuTest).mmu.super_MockMmu,&local_d0);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_b8,&local_d1,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                        ,0x8a,"mmu","read_byte(start_pc + 2u)");
    testing::Return<int>((testing *)&local_108,0x56);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_f8,(ReturnAction *)&local_108);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_f8);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f8);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_108);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b8);
    testing::Matcher<unsigned_short>::~Matcher(&local_d0);
    testing::Matcher<unsigned_short>::Matcher(&local_140,0x5609);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_128,&(this->super_CpuTest).mmu.super_MockMmu,&local_140);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_128,&local_141,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                        ,0x8b,"mmu","read_byte(0x5609)");
    testing::Return<int>((testing *)&local_178,0xcd);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_168,(ReturnAction *)&local_178);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_168)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_168);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_178);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_128);
    testing::Matcher<unsigned_short>::~Matcher(&local_140);
    testing::Matcher<unsigned_short>::Matcher(&local_1b0,0x5709);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_198,&(this->super_CpuTest).mmu.super_MockMmu,&local_1b0);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_198,&local_1b1,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                        ,0x8e,"mmu","read_byte(effective_address)");
    testing::Return<unsigned_char>((testing *)&local_1e8,(this->super_CpuTest).field_0x114);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_1d8,(ReturnAction *)&local_1e8);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_1d8)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1d8);
    testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_1e8);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_198);
    testing::Matcher<unsigned_short>::~Matcher(&local_1b0);
    testing::Matcher<unsigned_short>::Matcher(&local_238,0x5709);
    testing::Matcher<unsigned_char>::Matcher(&local_250,(this->super_CpuTest).field_0x114);
    n_e_s::core::test::MockMmu::gmock_write_byte
              (&local_220,&(this->super_CpuTest).mmu.super_MockMmu,&local_238,&local_250);
    testing::internal::GetWithoutMatchers();
    pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                       (&local_220,&local_251,(void *)0x0);
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
              (pMVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
               ,0x91,"mmu","write_byte(effective_address, memory_content)");
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_220);
    testing::Matcher<unsigned_char>::~Matcher(&local_250);
    testing::Matcher<unsigned_short>::~Matcher(&local_238);
    testing::Matcher<unsigned_short>::Matcher(&local_2a8,0x5709);
    testing::Matcher<unsigned_char>::Matcher(&local_2c0,local_19);
    n_e_s::core::test::MockMmu::gmock_write_byte
              (&local_290,&(this->super_CpuTest).mmu.super_MockMmu,&local_2a8,&local_2c0);
    testing::internal::GetWithoutMatchers();
    pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                       (&local_290,
                        (WithoutMatchers *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 7),(void *)0x0);
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
              (pMVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
               ,0x92,"mmu","write_byte(effective_address, new_memory_content)");
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_290);
    testing::Matcher<unsigned_char>::~Matcher(&local_2c0);
    testing::Matcher<unsigned_short>::~Matcher(&local_2a8);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\a');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_2d8,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
    if (!bVar4) {
      testing::Message::Message(&local_2e0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                 ,0x95,message);
      testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
      testing::Message::~Message(&local_2e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void run_readwrite_instruction_with_pagecrossing(uint8_t instruction,
            IndexReg index_reg,
            uint8_t new_memory_content) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const uint8_t index_reg_value{0x91};
        set_index_reg(index_reg, index_reg_value);

        const uint16_t effective_address = 0x5678 + index_reg_value;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0x78));
        EXPECT_CALL(mmu, read_byte(start_pc + 2u)).WillOnce(Return(0x56));
        EXPECT_CALL(mmu, read_byte(0x5609))
                .WillOnce(Return(
                        0xCD)); // Dummy read with on wrong page (0x5678 + 0x91)
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        EXPECT_CALL(mmu,
                write_byte(effective_address, memory_content)); // Dummy write
        EXPECT_CALL(mmu, write_byte(effective_address, new_memory_content));

        step_execution(7);
        EXPECT_EQ(expected, registers);
    }